

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop.c
# Opt level: O1

void read_stop(stop_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  location_type_t lVar2;
  wheelchair_boarding_t wVar3;
  ulong uVar4;
  char *pcVar5;
  stop_t *__dest;
  double dVar6;
  
  record->id[0] = '\0';
  record->code[0] = '\0';
  record->name[0] = '\0';
  record->desc[0] = '\0';
  record->lat = (longdouble)0;
  record->lon = (longdouble)0;
  record->zone_id[0] = '\0';
  record->url[0] = '\0';
  record->location_type = LT_STOP;
  record->parent_station[0] = '\0';
  record->timezone[0] = '\0';
  record->wheelchair_boarding = WB_UNKNOWN_OR_INHERITED;
  record->level_id[0] = '\0';
  record->platform_code[0] = '\0';
  if (0 < field_count) {
    uVar4 = 0;
    do {
      pcVar5 = field_names[uVar4];
      iVar1 = strcmp(pcVar5,"stop_id");
      if (iVar1 == 0) {
        pcVar5 = field_values[uVar4];
        __dest = record;
LAB_001073ed:
        strcpy(__dest->id,pcVar5);
      }
      else {
        iVar1 = strcmp(pcVar5,"stop_code");
        if (iVar1 == 0) {
          pcVar5 = field_values[uVar4];
          __dest = (stop_t *)record->code;
          goto LAB_001073ed;
        }
        iVar1 = strcmp(pcVar5,"stop_name");
        if (iVar1 == 0) {
          pcVar5 = field_values[uVar4];
          __dest = (stop_t *)record->name;
          goto LAB_001073ed;
        }
        iVar1 = strcmp(pcVar5,"stop_desc");
        if (iVar1 == 0) {
          pcVar5 = field_values[uVar4];
          __dest = (stop_t *)record->desc;
          goto LAB_001073ed;
        }
        iVar1 = strcmp(pcVar5,"stop_lat");
        if (iVar1 == 0) {
          dVar6 = strtod(field_values[uVar4],(char **)0x0);
          record->lat = (longdouble)dVar6;
        }
        else {
          iVar1 = strcmp(pcVar5,"stop_lon");
          if (iVar1 != 0) {
            iVar1 = strcmp(pcVar5,"zone_id");
            if (iVar1 == 0) {
              pcVar5 = field_values[uVar4];
              __dest = (stop_t *)record->zone_id;
            }
            else {
              iVar1 = strcmp(pcVar5,"stop_url");
              if (iVar1 == 0) {
                pcVar5 = field_values[uVar4];
                __dest = (stop_t *)record->url;
              }
              else {
                iVar1 = strcmp(pcVar5,"location_type");
                if (iVar1 == 0) {
                  lVar2 = parse_location_type(field_values[uVar4]);
                  record->location_type = lVar2;
                  goto LAB_001073f2;
                }
                iVar1 = strcmp(pcVar5,"parent_station");
                if (iVar1 == 0) {
                  pcVar5 = field_values[uVar4];
                  __dest = (stop_t *)record->parent_station;
                }
                else {
                  iVar1 = strcmp(pcVar5,"stop_timezone");
                  if (iVar1 == 0) {
                    pcVar5 = field_values[uVar4];
                    __dest = (stop_t *)record->timezone;
                  }
                  else {
                    iVar1 = strcmp(pcVar5,"wheelchair_boarding");
                    if (iVar1 == 0) {
                      wVar3 = parse_wheelchair_boarding(field_values[uVar4]);
                      record->wheelchair_boarding = wVar3;
                      goto LAB_001073f2;
                    }
                    iVar1 = strcmp(pcVar5,"level_id");
                    if (iVar1 == 0) {
                      pcVar5 = field_values[uVar4];
                      __dest = (stop_t *)record->level_id;
                    }
                    else {
                      iVar1 = strcmp(pcVar5,"platform_code");
                      if (iVar1 != 0) goto LAB_001073f2;
                      pcVar5 = field_values[uVar4];
                      __dest = (stop_t *)record->platform_code;
                    }
                  }
                }
              }
            }
            goto LAB_001073ed;
          }
          dVar6 = strtod(field_values[uVar4],(char **)0x0);
          record->lon = (longdouble)dVar6;
        }
      }
LAB_001073f2:
      uVar4 = uVar4 + 1;
    } while ((uint)field_count != uVar4);
  }
  return;
}

Assistant:

void read_stop(stop_t *record, int field_count, const char **field_names, const char **field_values) {
    init_stop(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "stop_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_code") == 0) {
            strcpy(record->code, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_name") == 0) {
            strcpy(record->name, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_desc") == 0) {
            strcpy(record->desc, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_lat") == 0) {
            record->lat = strtod(field_values[i], NULL);  // TODO: same as shape.c:26
            continue;
        }
        if (strcmp(field_names[i], "stop_lon") == 0) {
            record->lon = strtod(field_values[i], NULL);  // TODO: same as shape.c:26
            continue;
        }
        if (strcmp(field_names[i], "zone_id") == 0) {
            strcpy(record->zone_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_url") == 0) {
            strcpy(record->url, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "location_type") == 0) {
            record->location_type = parse_location_type(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "parent_station") == 0) {
            strcpy(record->parent_station, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "stop_timezone") == 0) {
            strcpy(record->timezone, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "wheelchair_boarding") == 0) {
            record->wheelchair_boarding = parse_wheelchair_boarding(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "level_id") == 0) {
            strcpy(record->level_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "platform_code") == 0) {
            strcpy(record->platform_code, field_values[i]);
            continue;
        }
    }
}